

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-io.h
# Opt level: O2

void __thiscall
mp::internal::AppSolutionHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::
AppSolutionHandlerImpl
          (AppSolutionHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter> *this,
          StringRef stub,TestSolver *s,StrictMockProblemBuilder *b,ArrayRef<long> *options,
          uint banner_size)

{
  ArrayRef<long> local_38;
  
  local_38.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.save_.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38.data_ = options->data_;
  local_38.size_ = options->size_;
  SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>::SolutionWriterImpl
            (&this->
              super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>,stub
             ,s,b,&local_38);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            ((_Vector_base<long,_std::allocator<long>_> *)&local_38);
  (this->super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>).
  super_SolutionHandler._vptr_SolutionHandler = (_func_int **)&PTR__SolutionWriterImpl_00263258;
  *(uint *)&(this->super_SolutionWriterImpl<TestSolver,_StrictMockProblemBuilder,_mp::SolFileWriter>
            ).field_0x84 = banner_size;
  return;
}

Assistant:

AppSolutionHandlerImpl(fmt::StringRef stub, Solver &s,
                    ProblemBuilder &b,
                    ArrayRef<long> options, unsigned banner_size)
  : SolutionWriterImpl<Solver, ProblemBuilder, Writer>
      (stub, s, b, options),  banner_size_(banner_size) {}